

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogAux.h
# Opt level: O3

void Assimp::LogFunctions<Assimp::FBXImporter>::LogWarn(format *message)

{
  bool bVar1;
  Logger *this;
  char *__s;
  long *plVar2;
  long *plVar3;
  long *message_00;
  long local_50;
  long lStack_48;
  long *local_40 [2];
  long local_30 [2];
  
  bVar1 = DefaultLogger::isNullLogger();
  if (!bVar1) {
    this = DefaultLogger::get();
    __s = Prefix();
    std::__cxx11::stringbuf::str();
    strlen(__s);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_40,0,(char *)0x0,(ulong)__s);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_50 = *plVar3;
      lStack_48 = plVar2[3];
      message_00 = &local_50;
    }
    else {
      local_50 = *plVar3;
      message_00 = (long *)*plVar2;
    }
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    Logger::warn(this,(char *)message_00);
    if (message_00 != &local_50) {
      operator_delete(message_00,local_50 + 1);
    }
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  return;
}

Assistant:

static void LogWarn(const Formatter::format& message)   {
        if (!DefaultLogger::isNullLogger()) {
            ASSIMP_LOG_WARN(Prefix()+(std::string)message);
        }
    }